

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.h
# Opt level: O2

void __thiscall muduo::Logger::SourceFile::SourceFile<100>(SourceFile *this,char (*arr) [100])

{
  char *pcVar1;
  
  this->data_ = *arr;
  this->size_ = 99;
  pcVar1 = strrchr(*arr,0x2f);
  if (pcVar1 != (char *)0x0) {
    this->data_ = pcVar1 + 1;
    this->size_ = ((int)arr - (int)(pcVar1 + 1)) + 99;
  }
  return;
}

Assistant:

SourceFile(const char (&arr)[N])
      : data_(arr),
        size_(N-1)
    {
      const char* slash = strrchr(data_, '/'); // builtin function
      if (slash)
      {
        data_ = slash + 1;
        size_ -= static_cast<int>(data_ - arr);
      }
    }